

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_instancenorm.cpp
# Opt level: O3

int main(void)

{
  ulong uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint64_t uVar5;
  uint uVar6;
  long lVar7;
  uint_fast16_t uVar8;
  ulong uVar9;
  bool bVar10;
  float a;
  float a_00;
  float b;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  void *ptr_1;
  void *ptr;
  Mat m;
  void *local_a0;
  Mat local_98;
  Mat local_58;
  
  auVar11 = _DAT_0016d020;
  auVar3 = _DAT_0016d010;
  g_prng_rand_state.c = 0x37;
  g_prng_rand_state.i = 0;
  g_prng_rand_state.s[0] = 0x7685dd;
  uVar5 = 0x1007685db;
  lVar7 = 0;
  do {
    auVar12._8_4_ = (int)lVar7;
    auVar12._0_8_ = lVar7;
    auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar12 = (auVar12 | auVar3) ^ auVar11;
    if (auVar12._4_4_ == -0x80000000 && auVar12._0_4_ < -0x7fffffc1) {
      g_prng_rand_state.s[lVar7 + 1] = uVar5 - 0x7fffffff;
      g_prng_rand_state.s[lVar7 + 2] = uVar5;
    }
    lVar7 = lVar7 + 2;
    uVar5 = uVar5 + 0xfffffffe;
  } while (lVar7 != 0x40);
  lVar7 = 0;
  do {
    uVar8 = g_prng_rand_state.i;
    uVar9 = 0;
    do {
      iVar4 = (int)uVar8;
      iVar2 = (int)uVar9;
      uVar1 = uVar9 + 1;
      g_prng_rand_state.s[iVar4 + iVar2 & 0x3f] =
           g_prng_rand_state.s[iVar4 + iVar2 + 9U & 0x3f] +
           g_prng_rand_state.s[iVar4 + iVar2 + 0x28U & 0x3f];
      if (g_prng_rand_state.c != 0) break;
      bVar10 = uVar9 < 0x1ef;
      uVar9 = uVar1;
    } while (bVar10);
    bVar10 = g_prng_rand_state.c == 0;
    g_prng_rand_state.c = g_prng_rand_state.c - 1;
    if (bVar10) {
      g_prng_rand_state.c = 0x36;
    }
    lVar7 = lVar7 + 1;
    g_prng_rand_state.i = uVar8 + uVar1;
    if (lVar7 == 10000) {
      g_prng_rand_state.i = uVar8 + uVar1;
      local_58.elemsize = 4;
      local_58.elempack = 1;
      local_58.allocator = (Allocator *)0x0;
      local_58.dims = 3;
      local_58.w = 6;
      local_58.h = 4;
      local_58.c = 2;
      local_58.cstep = 0x18;
      local_98.data = (void *)0x0;
      iVar4 = posix_memalign(&local_98.data,0x10,0xc4);
      b = auVar11._0_4_;
      local_58.data = (void *)0x0;
      if (iVar4 == 0) {
        local_58.data = local_98.data;
      }
      local_58.refcount = (int *)((long)local_58.data + 0xc0);
      *(undefined4 *)((long)local_58.data + 0xc0) = 1;
      Randomize(&local_58,a,b);
      iVar4 = test_instancenorm(&local_58,0.01);
      uVar6 = 1;
      if (iVar4 == 0) {
        local_98.elemsize = 4;
        local_98.elempack = 1;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 3;
        local_98.w = 3;
        local_98.h = 3;
        local_98.c = 8;
        local_98.cstep = 0xc;
        local_a0 = (void *)0x0;
        iVar4 = posix_memalign(&local_a0,0x10,0x184);
        local_98.data = (void *)0x0;
        if (iVar4 == 0) {
          local_98.data = local_a0;
        }
        local_98.refcount = (int *)((long)local_98.data + 0x180);
        *(undefined4 *)((long)local_98.data + 0x180) = 1;
        Randomize(&local_98,a_00,b);
        iVar4 = test_instancenorm(&local_98,0.002);
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + -1;
          UNLOCK();
          if (*local_98.refcount == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (**(code **)(*(long *)local_98.allocator + 0x18))();
            }
          }
        }
        uVar6 = (uint)(iVar4 != 0);
      }
      if (local_58.refcount != (int *)0x0) {
        LOCK();
        *local_58.refcount = *local_58.refcount + -1;
        UNLOCK();
        if (*local_58.refcount == 0) {
          if (local_58.allocator == (Allocator *)0x0) {
            if (local_58.data != (void *)0x0) {
              free(local_58.data);
            }
          }
          else {
            (**(code **)(*(long *)local_58.allocator + 0x18))();
          }
        }
      }
      return uVar6;
    }
  } while( true );
}

Assistant:

int main()
{
    SRAND(7767517);

    return 0
        || test_instancenorm_0()
        ;
}